

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttrListImpl.cpp
# Opt level: O1

XMLCh * __thiscall xercesc_4_0::VecAttrListImpl::getValue(VecAttrListImpl *this,XMLCh *name)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLAttr *this_00;
  XMLCh *pXVar3;
  XMLCh *pXVar4;
  XMLSize_t getAt;
  bool bVar5;
  
  if (this->fCount != 0) {
    getAt = 0;
    do {
      this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                          (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
      pXVar3 = XMLAttr::getQName(this_00);
      bVar5 = true;
      if (pXVar3 != name) {
        pXVar4 = name;
        if (pXVar3 == (XMLCh *)0x0 || name == (XMLCh *)0x0) {
          if (pXVar3 == (XMLCh *)0x0) {
            if (name != (XMLCh *)0x0) goto LAB_002bf7cb;
          }
          else {
            bVar5 = *pXVar3 == L'\0';
            if ((name != (XMLCh *)0x0) && (*pXVar3 == L'\0')) {
LAB_002bf7cb:
              bVar5 = *pXVar4 == L'\0';
            }
          }
        }
        else {
          do {
            XVar1 = *pXVar3;
            if (XVar1 == L'\0') goto LAB_002bf7cb;
            pXVar3 = pXVar3 + 1;
            XVar2 = *pXVar4;
            pXVar4 = pXVar4 + 1;
          } while (XVar1 == XVar2);
          bVar5 = false;
        }
      }
      if (bVar5) {
        return this_00->fValue;
      }
      getAt = getAt + 1;
    } while (getAt < this->fCount);
  }
  return (XMLCh *)0x0;
}

Assistant:

const XMLCh* VecAttrListImpl::getValue(const XMLCh* const name) const
{
    //
    //  Search the vector for the attribute with the given name and return
    //  its type.
    //
    for (XMLSize_t index = 0; index < fCount; index++)
    {
        const XMLAttr* curElem = fVector->elementAt(index);

        if (XMLString::equals(curElem->getQName(), name))
            return curElem->getValue();
    }
    return 0;
}